

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O0

EssentialVectorType * __thiscall
Eigen::
HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1>,_1>
::essentialVector(EssentialVectorType *__return_storage_ptr__,
                 HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1>,_1>
                 *this,Index k)

{
  bool bVar1;
  Index k_local;
  HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1>,_1>
  *this_local;
  
  bVar1 = false;
  if (-1 < k) {
    bVar1 = k < this->m_length;
  }
  if (!bVar1) {
    __assert_fail("k >= 0 && k < m_length",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Householder/HouseholderSequence.h"
                  ,0xe7,
                  "const EssentialVectorType Eigen::HouseholderSequence<Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, Eigen::VectorBlock<const Eigen::Matrix<float, -1, 1>>>::essentialVector(Index) const [VectorsType = Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, CoeffsType = Eigen::VectorBlock<const Eigen::Matrix<float, -1, 1>>, Side = 1]"
                 );
  }
  internal::
  hseq_side_dependent_impl<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1>,_1>
  ::essentialVector(__return_storage_ptr__,this,k);
  return __return_storage_ptr__;
}

Assistant:

essentialVector(Index k) const
    {
      eigen_assert(k >= 0 && k < m_length);
      return internal::hseq_side_dependent_impl<VectorsType,CoeffsType,Side>::essentialVector(*this, k);
    }